

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

void __thiscall
QSslConfiguration::setBackendConfiguration
          (QSslConfiguration *this,QMap<QByteArray,_QVariant> *backendConfiguration)

{
  QSslConfigurationPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QSslConfigurationPrivate>::operator->(&this->d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::operator=(&(pQVar1->backendConfig).d,&backendConfiguration->d);
  return;
}

Assistant:

void QSslConfiguration::setBackendConfiguration(const QMap<QByteArray, QVariant> &backendConfiguration)
{
    d->backendConfig = backendConfiguration;
}